

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicFixedWingAircraft.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GED_BasicFixedWingAircraft
          (GED_BasicFixedWingAircraft *this,KUINT16 ID,KINT16 XOffset,KINT16 YOffset,KINT16 ZOffset,
          EntityAppearance *EA,KINT8 Psi,KINT8 Theta,KINT8 Phi,KUINT8 FuelStatus,
          KINT8 HorizontalDeviation,KINT8 VerticalDeviation,KINT16 Speed)

{
  DataTypeBase::DataTypeBase((DataTypeBase *)this);
  (this->super_GED).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GED_BasicFixedWingAircraft_00312648;
  this->m_ui16EntityID = ID;
  (this->m_EA).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__EntityAppearance_003116a8
  ;
  (this->m_EA).m_Appearance = EA->m_Appearance;
  this->m_ui8FuelStatus = FuelStatus;
  this->m_i8HoriDevi = HorizontalDeviation;
  this->m_i8VertDevi = VerticalDeviation;
  this->m_i16Offsets[0] = XOffset;
  this->m_i16Offsets[1] = YOffset;
  this->m_i16Offsets[2] = ZOffset;
  this->m_i8Ori[0] = Psi;
  this->m_i8Ori[1] = Theta;
  this->m_i8Ori[2] = Phi;
  return;
}

Assistant:

GED_BasicFixedWingAircraft::GED_BasicFixedWingAircraft( KUINT16 ID, KINT16 XOffset, KINT16 YOffset, KINT16 ZOffset, const EntityAppearance & EA, KINT8 Psi, KINT8 Theta,
        KINT8 Phi, KUINT8 FuelStatus, KINT8 HorizontalDeviation, KINT8 VerticalDeviation, KINT16 Speed ) :
    m_ui16EntityID( ID ),
    m_EA( EA ),
    m_ui8FuelStatus( FuelStatus ),
    m_i8HoriDevi( HorizontalDeviation ),
    m_i8VertDevi( VerticalDeviation )
{
    m_i16Offsets[0] = XOffset;
    m_i16Offsets[1] = YOffset;
    m_i16Offsets[2] = ZOffset;
    m_i8Ori[0] = Psi;
    m_i8Ori[1] = Theta;
    m_i8Ori[2] = Phi;
}